

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9_rle.h
# Opt level: O0

int32_t FastPForLib::Simple9_Codec::Compress
                  (uint32_t *input,int32_t inOffset,uint32_t inCount,uint32_t *output,
                  int32_t outOffset)

{
  uint uVar1;
  uint local_50;
  uint32_t inputVal;
  uint32_t j;
  uint32_t val;
  uint32_t maxVal;
  uint32_t bitLen;
  uint32_t intNum;
  uint32_t code;
  uint32_t outVal;
  uint32_t remainingCount;
  uint32_t outPos;
  uint32_t inEnd;
  uint32_t inPos;
  int32_t outOffset_local;
  uint32_t *output_local;
  uint32_t inCount_local;
  int32_t inOffset_local;
  uint32_t *input_local;
  
  outPos = outOffset;
  inPos = inOffset;
  do {
    if (inOffset + inCount <= inPos) {
      return outPos - outOffset;
    }
    uVar1 = (inOffset + inCount) - inPos;
    outVal = 0;
    for (code = 0; code < 8; code = code + 1) {
      local_50 = uVar1;
      if (*(uint *)(Simple9_Codec_intNumber + (ulong)code * 4) < uVar1) {
        local_50 = *(uint *)(Simple9_Codec_intNumber + (ulong)code * 4);
      }
      val = code << 0x1c;
      j = 0;
      while ((j < local_50 &&
             (input[inPos + j] <=
              (1 << ((byte)*(undefined4 *)(Simple9_Codec_bitLength + (ulong)code * 4) & 0x1f)) - 1U)
             )) {
        val = input[inPos + j] <<
              ((char)j * (byte)*(undefined4 *)(Simple9_Codec_bitLength + (ulong)code * 4) & 0x1f) |
              val;
        j = j + 1;
      }
      if (j == local_50) {
        outVal = val;
        inPos = local_50 + inPos;
        break;
      }
    }
    if (code == 8) {
      outVal = input[inPos] | 0x80000000;
      inPos = inPos + 1;
    }
    output[outPos] = outVal;
    outPos = outPos + 1;
  } while( true );
}

Assistant:

static int32_t Compress(const uint32_t *input, int32_t inOffset,
                          uint32_t inCount, uint32_t *output,
                          int32_t outOffset) {
    uint32_t inPos = inOffset;
    uint32_t inEnd = inOffset + inCount;
    uint32_t outPos = outOffset;

    while (inPos < inEnd) {
      uint32_t remainingCount = inEnd - inPos;
      uint32_t outVal = 0;

#if defined(_SIMPLE9_USE_RLE)
      // try if run-length encoding packs better than bit packing
      uint32_t repeatCount = tryRunLength(input, inPos, remainingCount);
      if (repeatCount > 0) {
        repeatCount = (repeatCount < RLE_MAX_COUNT_MASK) ? repeatCount
                                                         : RLE_MAX_COUNT_MASK;
        outVal = (RLE_SELECTOR_VALUE << SIMPLE9_BITSIZE) |
                 (repeatCount << RLE_MAX_VALUE_BITS) | input[inPos];
        inPos += repeatCount;
      } else
#endif
      {
        // try all the bit packing possibilities
        uint32_t code = SIMPLE9_MINCODE;
        for (; code < SIMPLE9_MAXCODE; code++) {
          uint32_t intNum = Simple9_Codec_intNumber[code];
          uint32_t bitLen = Simple9_Codec_bitLength[code];
          intNum = (intNum < remainingCount) ? intNum : remainingCount;

          uint32_t maxVal = (1U << bitLen) - 1;
          uint32_t val = code << SIMPLE9_BITSIZE;
          uint32_t j = 0;
          for (; j < intNum; j++) {
            uint32_t inputVal = input[inPos + j];
            if (inputVal > maxVal) {
              break;
            }
            val |= inputVal << (j * bitLen);
          }
          if (j == intNum) {
            outVal = val;
            inPos += intNum;
            break;
          }
        }
        // if no bit packing possible, encode just one value (up to INT_MAX)
        if (code == SIMPLE9_MAXCODE) {
          outVal = (code << SIMPLE9_BITSIZE) | input[inPos++];
        }
      }
      output[outPos++] = outVal;
    }
    return outPos - outOffset;
  }